

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

float Abc_SclComputeDelayClassPin(SC_Lib *p,SC_Cell *pRepr,int iPin,float Slew,float Gain)

{
  int iVar1;
  int iVar2;
  SC_Cell *pCell;
  float LD;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  double local_38;
  
  local_38 = (double)Gain;
  local_3c = 0.0;
  iVar2 = 0;
  pCell = pRepr;
  local_40 = Slew;
  do {
    if (pCell->fSkip == 0) {
      local_44 = 0.0;
      local_48 = 0.0;
      Abc_SclComputeParametersPin(p,pCell,iPin,local_40,&local_44,&local_48);
      local_3c = local_3c + (float)((double)local_48 + (double)local_44 * 0.01 * local_38);
      iVar2 = iVar2 + 1;
    }
    pCell = pCell->pNext;
  } while (pCell != pRepr);
  iVar1 = 1;
  if (1 < iVar2) {
    iVar1 = iVar2;
  }
  return local_3c / (float)iVar1;
}

Assistant:

float Abc_SclComputeDelayClassPin( SC_Lib * p, SC_Cell * pRepr, int iPin, float Slew, float Gain )
{
    SC_Cell * pCell;
    float Delay = 0;
    int i, Count = 0;
    SC_RingForEachCell( pRepr, pCell, i )
    {
        if ( pCell->fSkip ) 
            continue;
//        if ( pRepr == pCell ) // skip the first gate
//            continue;
        Delay += Abc_SclComputeDelayCellPin( p, pCell, iPin, Slew, Gain );
        Count++;
    }
    return Delay / Abc_MaxInt(1, Count);
}